

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

void MAFSA_automaton_close(MAFSA_automaton ma)

{
  undefined8 *in_RDI;
  
  if (in_RDI != (undefined8 *)0x0) {
    if (*(int *)(in_RDI + 2) == 0) {
      free((void *)*in_RDI);
      free((void *)in_RDI[1]);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

extern void MAFSA_automaton_close(MAFSA_automaton ma)
{
    if (0 == ma)
    {
        return;
    }

    if (0 == ma->shared)
    {
        free(ma->ptr_nodes);
        free(ma->ptr_links);
    }

    free(ma);
}